

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> * __thiscall
rcg::Device::getStreams
          (vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
           *__return_storage_ptr__,Device *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  int iVar3;
  GC_ERROR GVar4;
  size_t sVar5;
  string *psVar6;
  Stream *this_00;
  pointer psVar7;
  GenTLException *pGVar8;
  pointer pwVar9;
  uint uVar10;
  uint32_t uVar11;
  ulong uVar12;
  long lVar13;
  vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_> *this_01;
  bool bVar14;
  uint32_t n;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> current;
  size_t size;
  shared_ptr<rcg::Stream> p;
  uint32_t local_194;
  string local_190;
  shared_ptr<const_rcg::GenTLWrapper> *local_170;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> local_168;
  size_t local_150;
  __shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  string local_138 [8];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
LAB_0010e33f:
    pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Device::getStreams()","");
    GenTLException::GenTLException(pGVar8,local_138,local_170);
    __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->dev != (void *)0x0) {
    local_168.
    super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.
    super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pwVar9 = (this->slist).
             super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->slist).
        super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pwVar9) {
      uVar12 = 0;
      do {
        local_138[0]._M_string_length =
             (size_type)
             pwVar9[uVar12].super___weak_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar3 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
                  _M_use_count;
          do {
            if (iVar3 == 0) {
              local_138[0]._M_string_length = 0;
              break;
            }
            LOCK();
            iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)
                    ->_M_use_count;
            bVar14 = iVar3 == iVar2;
            if (bVar14) {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
              _M_use_count = iVar3 + 1;
              iVar2 = iVar3;
            }
            iVar3 = iVar2;
            UNLOCK();
          } while (!bVar14);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar14 = true;
        }
        else {
          bVar14 = *(_Atomic_word *)(local_138[0]._M_string_length + 8) == 0;
        }
        if (bVar14) {
          local_138[0]._M_dataplus._M_p = (pointer)0x0;
        }
        else {
          local_138[0]._M_dataplus._M_p =
               (pointer)pwVar9[uVar12].super___weak_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
        }
        if ((element_type *)local_138[0]._M_dataplus._M_p != (element_type *)0x0) {
          std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
          ::push_back(&local_168,(value_type *)local_138);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length);
        }
        uVar12 = uVar12 + 1;
        pwVar9 = (this->slist).
                 super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(this->slist).
                                      super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pwVar9 >> 4
                               ));
    }
    local_194 = 0;
    GVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DevGetNumDataStreams)(this->dev,&local_194);
    local_170 = &this->gentl;
    if (GVar4 != 0) goto LAB_0010e33f;
    if (local_194 != 0) {
      uVar11 = 0;
      do {
        memset(local_138,0,0x100);
        local_150 = 0x100;
        GVar4 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DevGetDataStreamID)(this->dev,uVar11,(char *)local_138,&local_150);
        if (GVar4 != 0) {
          pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"Device::getStreams()","");
          GenTLException::GenTLException(pGVar8,&local_190,local_170);
          __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        sVar5 = strlen((char *)local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,local_138,(long)&local_138[0]._M_dataplus._M_p + sVar5);
        uVar10 = 0xffffffff;
        if (local_168.
            super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_168.
            super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar13 = 0;
          uVar12 = 0;
          do {
            psVar6 = Stream::getID_abi_cxx11_
                               (*(Stream **)
                                 ((long)&((local_168.
                                           super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar13));
            __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar6->_M_string_length;
            if ((__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_string_length)
               && ((__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
                   (iVar3 = bcmp((psVar6->_M_dataplus)._M_p,local_190._M_dataplus._M_p,(size_t)__n),
                   iVar3 == 0)))) {
              uVar10 = (uint)uVar12;
              break;
            }
            uVar12 = uVar12 + 1;
            lVar13 = lVar13 + 0x10;
            uVar10 = 0xffffffff;
          } while (uVar12 < (ulong)((long)local_168.
                                          super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_168.
                                          super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((int)uVar10 < 0) {
          this_00 = (Stream *)operator_new(0x108);
          std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
                    (local_148,(__weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)this);
          Stream::Stream(this_00,(shared_ptr<rcg::Device> *)local_148,local_170,(char *)local_138);
          std::__shared_ptr<rcg::Stream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Stream,void>
                    ((__shared_ptr<rcg::Stream,(__gnu_cxx::_Lock_policy)2> *)&local_190,this_00);
          std::vector<std::shared_ptr<rcg::Stream>,std::allocator<std::shared_ptr<rcg::Stream>>>::
          emplace_back<std::shared_ptr<rcg::Stream>>
                    ((vector<std::shared_ptr<rcg::Stream>,std::allocator<std::shared_ptr<rcg::Stream>>>
                      *)__return_storage_ptr__,(shared_ptr<rcg::Stream> *)&local_190);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_string_length);
          }
          if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
          }
        }
        else {
          std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
          ::push_back(__return_storage_ptr__,
                      local_168.
                      super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar10);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_194);
    }
    this_01 = &this->slist;
    std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::
    _M_erase_at_end(this_01,(this_01->
                            super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    psVar7 = (__return_storage_ptr__->
             super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != psVar7) {
      lVar13 = 8;
      uVar12 = 0;
      do {
        local_138[0]._M_dataplus._M_p = *(pointer *)((long)psVar7 + lVar13 + -8);
        local_138[0]._M_string_length =
             *(long *)((long)&(psVar7->super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar13);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
            _M_weak_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
                 _M_weak_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
            _M_weak_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
                 _M_weak_count + 1;
          }
        }
        std::vector<std::weak_ptr<rcg::Stream>,std::allocator<std::weak_ptr<rcg::Stream>>>::
        emplace_back<std::weak_ptr<rcg::Stream>>
                  ((vector<std::weak_ptr<rcg::Stream>,std::allocator<std::weak_ptr<rcg::Stream>>> *)
                   this_01,(weak_ptr<rcg::Stream> *)local_138);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_138[0]._M_string_length + 0xc);
            iVar3 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar3 = *(_Atomic_word *)(local_138[0]._M_string_length + 0xc);
            *(int *)(local_138[0]._M_string_length + 0xc) = iVar3 + -1;
          }
          if (iVar3 == 1) {
            (*(*(_func_int ***)local_138[0]._M_string_length)[3])();
          }
        }
        uVar12 = uVar12 + 1;
        psVar7 = (__return_storage_ptr__->
                 super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x10;
      } while (uVar12 < (ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >>
                               4));
    }
    std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
    ~vector(&local_168);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Stream> > Device::getStreams()
{
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<std::shared_ptr<Stream> > ret;

  if (dev != 0)
  {
    // get list of previously requested streams that are still in use

    std::vector<std::shared_ptr<Stream> > current;

    for (size_t i=0; i<slist.size(); i++)
    {
      std::shared_ptr<Stream> p=slist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }

    // create list of streams, using either existing streams or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->DevGetNumDataStreams(dev, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getStreams()", gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->DevGetDataStreamID(dev, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("Device::getStreams()", gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Stream>(new Stream(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of streams for reusage on next call

    slist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      slist.push_back(ret[i]);
    }
  }

  return ret;

}